

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O0

int cdef_find_dir_c(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined4 in_ECX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int j_1;
  int x;
  int j;
  int best_dir;
  int32_t best_cost;
  int partial [8] [15];
  int32_t cost [8];
  int i;
  int local_23c;
  int local_234;
  int local_230;
  int local_22c;
  int local_228 [30];
  int aiStack_1b0 [30];
  int aiStack_138 [30];
  int aiStack_c0 [30];
  int local_48 [10];
  int local_20;
  undefined4 local_1c;
  int *local_18;
  int local_c;
  long local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_48,0,0x20);
  memset(local_228,0,0x1e0);
  local_22c = 0;
  local_230 = 0;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    for (local_234 = 0; local_234 < 8; local_234 = local_234 + 1) {
      iVar1 = ((int)(uint)*(ushort *)(local_8 + (long)(local_20 * local_c + local_234) * 2) >>
              ((byte)local_1c & 0x1f)) + -0x80;
      local_228[local_20 + local_234] = iVar1 + local_228[local_20 + local_234];
      lVar3 = (long)(local_20 + local_234 / 2);
      aiStack_1b0[lVar3 + -0xf] = iVar1 + aiStack_1b0[lVar3 + -0xf];
      aiStack_1b0[local_20] = iVar1 + aiStack_1b0[local_20];
      lVar3 = (long)((local_20 + 3) - local_234 / 2);
      aiStack_138[lVar3 + -0xf] = iVar1 + aiStack_138[lVar3 + -0xf];
      iVar2 = (local_20 + 7) - local_234;
      aiStack_138[iVar2] = iVar1 + aiStack_138[iVar2];
      lVar3 = (long)((3 - local_20 / 2) + local_234);
      aiStack_c0[lVar3 + -0xf] = iVar1 + aiStack_c0[lVar3 + -0xf];
      aiStack_c0[local_234] = iVar1 + aiStack_c0[local_234];
      lVar3 = (long)(local_20 / 2 + local_234);
      local_48[lVar3 + -0xf] = iVar1 + local_48[lVar3 + -0xf];
    }
  }
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    local_48[2] = aiStack_1b0[local_20] * aiStack_1b0[local_20] + local_48[2];
    local_48[6] = aiStack_c0[local_20] * aiStack_c0[local_20] + local_48[6];
  }
  local_48[2] = local_48[2] * 0x69;
  local_48[6] = local_48[6] * 0x69;
  for (local_20 = 0; local_20 < 7; local_20 = local_20 + 1) {
    local_48[0] = (local_228[local_20] * local_228[local_20] +
                  local_228[0xe - local_20] * local_228[0xe - local_20]) *
                  cdef_find_dir_c::div_table[local_20 + 1] + local_48[0];
    local_48[4] = (aiStack_138[local_20] * aiStack_138[local_20] +
                  aiStack_138[0xe - local_20] * aiStack_138[0xe - local_20]) *
                  cdef_find_dir_c::div_table[local_20 + 1] + local_48[4];
  }
  local_48[0] = local_228[7] * local_228[7] * 0x69 + local_48[0];
  local_48[4] = aiStack_138[7] * aiStack_138[7] * 0x69 + local_48[4];
  for (local_20 = 1; local_20 < 8; local_20 = local_20 + 2) {
    for (local_23c = 0; local_23c < 5; local_23c = local_23c + 1) {
      local_48[local_20] =
           local_228[(long)local_20 * 0xf + (long)(local_23c + 3)] *
           local_228[(long)local_20 * 0xf + (long)(local_23c + 3)] + local_48[local_20];
    }
    local_48[local_20] = local_48[local_20] * 0x69;
    for (local_23c = 0; local_23c < 3; local_23c = local_23c + 1) {
      local_48[local_20] =
           (local_228[(long)local_20 * 0xf + (long)local_23c] *
            local_228[(long)local_20 * 0xf + (long)local_23c] +
           local_228[(long)local_20 * 0xf + (long)(10 - local_23c)] *
           local_228[(long)local_20 * 0xf + (long)(10 - local_23c)]) *
           cdef_find_dir_c::div_table[local_23c * 2 + 2] + local_48[local_20];
    }
  }
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    if (local_22c < local_48[local_20]) {
      local_22c = local_48[local_20];
      local_230 = local_20;
    }
  }
  *local_18 = local_22c - local_48[(int)(local_230 + 4U & 7)];
  *local_18 = *local_18 >> 10;
  return local_230;
}

Assistant:

int cdef_find_dir_c(const uint16_t *img, int stride, int32_t *var,
                    int coeff_shift) {
  int i;
  int32_t cost[8] = { 0 };
  int partial[8][15] = { { 0 } };
  int32_t best_cost = 0;
  int best_dir = 0;
  /* Instead of dividing by n between 2 and 8, we multiply by 3*5*7*8/n.
     The output is then 840 times larger, but we don't care for finding
     the max. */
  static const int div_table[] = { 0, 840, 420, 280, 210, 168, 140, 120, 105 };
  for (i = 0; i < 8; i++) {
    int j;
    for (j = 0; j < 8; j++) {
      int x;
      /* We subtract 128 here to reduce the maximum range of the squared
         partial sums. */
      x = (img[i * stride + j] >> coeff_shift) - 128;
      partial[0][i + j] += x;
      partial[1][i + j / 2] += x;
      partial[2][i] += x;
      partial[3][3 + i - j / 2] += x;
      partial[4][7 + i - j] += x;
      partial[5][3 - i / 2 + j] += x;
      partial[6][j] += x;
      partial[7][i / 2 + j] += x;
    }
  }
  for (i = 0; i < 8; i++) {
    cost[2] += partial[2][i] * partial[2][i];
    cost[6] += partial[6][i] * partial[6][i];
  }
  cost[2] *= div_table[8];
  cost[6] *= div_table[8];
  for (i = 0; i < 7; i++) {
    cost[0] += (partial[0][i] * partial[0][i] +
                partial[0][14 - i] * partial[0][14 - i]) *
               div_table[i + 1];
    cost[4] += (partial[4][i] * partial[4][i] +
                partial[4][14 - i] * partial[4][14 - i]) *
               div_table[i + 1];
  }
  cost[0] += partial[0][7] * partial[0][7] * div_table[8];
  cost[4] += partial[4][7] * partial[4][7] * div_table[8];
  for (i = 1; i < 8; i += 2) {
    int j;
    for (j = 0; j < 4 + 1; j++) {
      cost[i] += partial[i][3 + j] * partial[i][3 + j];
    }
    cost[i] *= div_table[8];
    for (j = 0; j < 4 - 1; j++) {
      cost[i] += (partial[i][j] * partial[i][j] +
                  partial[i][10 - j] * partial[i][10 - j]) *
                 div_table[2 * j + 2];
    }
  }
  for (i = 0; i < 8; i++) {
    if (cost[i] > best_cost) {
      best_cost = cost[i];
      best_dir = i;
    }
  }
  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}